

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode multi_runsingle(Curl_multi *multi,curltime now,Curl_easy *data)

{
  CURLMstate CVar1;
  curl_off_t cVar2;
  _func_CURLcode_connectdata_ptr__Bool_ptr *p_Var3;
  char *hostname;
  Curl_do_more_func p_Var4;
  multidone_func p_Var5;
  uint uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  undefined4 uVar16;
  undefined8 uVar17;
  undefined4 uVar18;
  undefined8 uVar19;
  undefined4 uVar20;
  curltime now_00;
  curltime now_01;
  curltime now_02;
  curltime now_03;
  _Bool _Var21;
  CURLcode CVar22;
  CURLcode CVar23;
  CURLcode CVar24;
  int iVar25;
  CURLMcode CVar26;
  timediff_t tVar27;
  connectdata *pcVar28;
  long lVar29;
  long lVar30;
  CURLMstate CVar31;
  int iVar32;
  followtype type;
  connectdata *conn;
  bool bVar33;
  curltime now_04;
  curltime now_05;
  curltime now_06;
  curltime older;
  curltime older_00;
  curltime older_01;
  curltime start;
  curltime start_00;
  curltime start_01;
  curltime start_02;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  _Bool protocol_connect;
  _Bool dophase_done;
  _Bool done;
  _Bool comeback;
  char *newurl;
  _Bool async;
  _Bool connected;
  curltime now_local;
  int control;
  curl_llist_element *local_50;
  curl_llist *local_48;
  curl_llist *local_40;
  Curl_message *local_38;
  
  now_local.tv_sec = now.tv_sec;
  now_local.tv_usec = now.tv_usec;
  protocol_connect = false;
  dophase_done = false;
  done = false;
  CVar26 = CURLM_BAD_EASY_HANDLE;
  if ((data != (Curl_easy *)0x0) && (data->magic == 0xc0dedbad)) {
    local_48 = &multi->pending;
    local_50 = &data->connect_queue;
    local_38 = &data->msg;
    local_40 = &multi->msglist;
    CVar23 = CURLE_OK;
    do {
      pcVar28 = data->conn;
      if ((pcVar28 == (connectdata *)0x0) && (data->mstate - CURLM_STATE_WAITRESOLVE < 0xb)) {
        Curl_failf(data,"In state %d with no conn, bail out!\n");
        return CURLM_INTERNAL_ERROR;
      }
      _Var21 = multi->recheckstate;
      multi->recheckstate = false;
      if (_Var21 == true) {
        process_pending_handles(multi);
        pcVar28 = data->conn;
      }
      CVar31 = data->mstate;
      if (pcVar28 != (connectdata *)0x0) {
        if (CVar31 - CURLM_STATE_WAITRESOLVE < 0xc) {
          pcVar28->data = data;
        }
        else if (0xc < CVar31 - CURLM_STATE_CONNECT) goto LAB_003d931e;
        tVar27 = Curl_timeleft(data,&now_local,CVar31 < CURLM_STATE_DOING);
        CVar31 = data->mstate;
        if (-1 < tVar27) goto LAB_003d931e;
        if (CVar31 == CURLM_STATE_WAITCONNECT) {
          newer_00.tv_usec = now_local.tv_usec;
          newer_00.tv_sec = now_local.tv_sec;
          uVar9 = (data->progress).t_startsingle.tv_sec;
          uVar10 = (data->progress).t_startsingle.tv_usec;
          older_00.tv_usec = uVar10;
          older_00.tv_sec = uVar9;
          older_00._12_4_ = 0;
          newer_00._12_4_ = 0;
          tVar27 = Curl_timediff(newer_00,older_00);
          Curl_failf(data,"Connection timed out after %ld milliseconds",tVar27);
        }
        else if (CVar31 == CURLM_STATE_WAITRESOLVE) {
          newer.tv_usec = now_local.tv_usec;
          newer.tv_sec = now_local.tv_sec;
          uVar7 = (data->progress).t_startsingle.tv_sec;
          uVar8 = (data->progress).t_startsingle.tv_usec;
          older.tv_usec = uVar8;
          older.tv_sec = uVar7;
          older._12_4_ = 0;
          newer._12_4_ = 0;
          tVar27 = Curl_timediff(newer,older);
          Curl_failf(data,"Resolving timed out after %ld milliseconds",tVar27);
        }
        else {
          lVar29 = (data->req).size;
          newer_01.tv_usec = now_local.tv_usec;
          newer_01.tv_sec = now_local.tv_sec;
          uVar11 = (data->progress).t_startsingle.tv_sec;
          uVar12 = (data->progress).t_startsingle.tv_usec;
          older_01.tv_usec = uVar12;
          older_01.tv_sec = uVar11;
          older_01._12_4_ = 0;
          newer_01._12_4_ = 0;
          tVar27 = Curl_timediff(newer_01,older_01);
          cVar2 = (data->req).bytecount;
          if (lVar29 == -1) {
            Curl_failf(data,"Operation timed out after %ld milliseconds with %ld bytes received",
                       tVar27,cVar2);
          }
          else {
            Curl_failf(data,
                       "Operation timed out after %ld milliseconds with %ld out of %ld bytes received"
                       ,tVar27,cVar2,(data->req).size);
          }
        }
        bVar33 = CURLM_STATE_DO < data->mstate;
        if (bVar33) {
          Curl_conncontrol(data->conn,2);
        }
        CVar23 = CURLE_OPERATION_TIMEDOUT;
        multi_done(data,CURLE_OPERATION_TIMEDOUT,true);
        goto LAB_003d9f9e;
      }
LAB_003d931e:
      iVar32 = 0;
      iVar25 = 0;
      switch(CVar31) {
      case CURLM_STATE_INIT:
        CVar23 = Curl_pretransfer(data);
        if (CVar23 != CURLE_OK) {
LAB_003d9b2d:
          bVar33 = false;
          goto LAB_003d9f9e;
        }
        if (data->mstate != CURLM_STATE_CONNECT) {
          data->mstate = CURLM_STATE_CONNECT;
          Curl_init_CONNECT(data);
        }
        Curl_pgrsTime(data,TIMER_STARTOP);
LAB_003d9be5:
        bVar33 = false;
        goto LAB_003d9be8;
      case CURLM_STATE_CONNECT_PEND:
      case CURLM_STATE_COMPLETED:
switchD_003d9334_caseD_1:
        iVar32 = iVar25;
        bVar33 = false;
        break;
      case CURLM_STATE_CONNECT:
        Curl_pgrsTime(data,TIMER_STARTSINGLE);
        lVar29 = (data->set).timeout;
        if (lVar29 != 0) {
          Curl_expire(data,lVar29,EXPIRE_TIMEOUT);
        }
        lVar29 = (data->set).connecttimeout;
        if (lVar29 != 0) {
          Curl_expire(data,lVar29,EXPIRE_CONNECTTIMEOUT);
        }
        CVar23 = Curl_connect(data,&async,&protocol_connect);
        if (CVar23 == CURLE_NO_CONNECTION_AVAILABLE) {
          if (data->mstate != CURLM_STATE_CONNECT_PEND) {
            data->mstate = CURLM_STATE_CONNECT_PEND;
          }
          Curl_llist_insert_next(local_48,(multi->pending).tail,data,local_50);
          goto LAB_003d9f99;
        }
        if (((data->state).field_0x4e5 & 0x20) != 0) {
          Curl_infof(data,"Transfer was pending, now try another\n");
          process_pending_handles(data->multi);
        }
        if (CVar23 != CURLE_OK) goto LAB_003d9b2d;
        if (async == true) {
          bVar33 = data->mstate == CURLM_STATE_WAITRESOLVE;
          CVar31 = CURLM_STATE_WAITRESOLVE;
          goto LAB_003d9e3b;
        }
        if (protocol_connect == true) goto LAB_003d9b00;
        _Var21 = Curl_connect_ongoing(data->conn);
        if (_Var21) {
          CVar31 = CURLM_STATE_WAITPROXYCONNECT;
          iVar32 = -1;
          iVar25 = iVar32;
          if (data->mstate != CURLM_STATE_WAITPROXYCONNECT) goto LAB_003d9e42;
        }
        else {
          CVar31 = CURLM_STATE_WAITCONNECT;
          iVar32 = -1;
          iVar25 = iVar32;
          if (data->mstate != CURLM_STATE_WAITCONNECT) goto LAB_003d9e42;
        }
        goto LAB_003da004;
      case CURLM_STATE_WAITRESOLVE:
        newurl = (char *)0x0;
        pcVar28 = data->conn;
        uVar6 = *(uint *)&(pcVar28->bits).field_0x4;
        lVar29 = 0x100;
        if ((uVar6 & 4) == 0) {
          lVar29 = 0xd0;
        }
        if ((uVar6 & 0x20) != 0) {
          lVar29 = 0x160;
        }
        hostname = *(char **)((pcVar28->chunk).hexbuffer + lVar29 + -0x20);
        newurl = (char *)Curl_fetch_addr(pcVar28,hostname,(int)pcVar28->port);
        if ((Curl_dns_entry *)newurl == (Curl_dns_entry *)0x0) {
LAB_003d95b5:
          CVar23 = Curl_resolv_check(data->conn,(Curl_dns_entry **)&newurl);
        }
        else {
          CVar23 = CURLE_OK;
          Curl_infof(data,"Hostname \'%s\' was found in DNS cache\n",hostname);
          if (newurl == (char *)0x0) goto LAB_003d95b5;
        }
        singlesocket(multi,data);
        if (newurl == (char *)0x0) {
          bVar33 = CVar23 != CURLE_OK;
        }
        else {
          CVar23 = Curl_once_resolved(data->conn,&protocol_connect);
          if (CVar23 == CURLE_OK) {
            if (protocol_connect == true) {
              CVar23 = CURLE_OK;
              iVar32 = -1;
              bVar33 = false;
              if (data->mstate != CURLM_STATE_DO) {
                data->mstate = CURLM_STATE_DO;
                Curl_connect_free(data);
                CVar23 = CURLE_OK;
                iVar25 = -1;
                goto switchD_003d9334_caseD_1;
              }
            }
            else {
              _Var21 = Curl_connect_ongoing(data->conn);
              CVar23 = CURLE_OK;
              iVar32 = -1;
              bVar33 = false;
              if (_Var21) {
                if (data->mstate != CURLM_STATE_WAITPROXYCONNECT) {
                  data->mstate = CURLM_STATE_WAITPROXYCONNECT;
LAB_003d9ea8:
                  CVar23 = CURLE_OK;
                  iVar25 = iVar32;
                  goto switchD_003d9334_caseD_1;
                }
              }
              else if (data->mstate != CURLM_STATE_WAITCONNECT) {
                data->mstate = CURLM_STATE_WAITCONNECT;
                goto LAB_003d9ea8;
              }
            }
            break;
          }
          data->conn = (connectdata *)0x0;
          bVar33 = true;
        }
        goto LAB_003d9f9e;
      case CURLM_STATE_WAITCONNECT:
        CVar23 = Curl_is_connected(data->conn,0,&connected);
        if ((CVar23 == CURLE_OK & connected) != 1) {
          iVar32 = 0;
          if (CVar23 != CURLE_OK) goto LAB_003d97d4;
          bVar33 = false;
          CVar23 = CURLE_OK;
          break;
        }
        pcVar28 = data->conn;
        if ((((pcVar28->http_proxy).proxytype != CURLPROXY_HTTPS) ||
            ((pcVar28->bits).proxy_ssl_connected[0] == true)) &&
           (_Var21 = Curl_connect_ongoing(pcVar28), !_Var21)) {
          uVar6 = *(uint *)&(data->conn->bits).field_0x4 >> 0xe;
          iVar25 = 5;
LAB_003d9bd9:
          CVar31 = (iVar25 + 1) - (uint)((uVar6 & 1) != 0);
LAB_003d9bdd:
          mstate(data,CVar31);
          goto LAB_003d9be5;
        }
        bVar33 = data->mstate == CURLM_STATE_WAITPROXYCONNECT;
        CVar31 = CURLM_STATE_WAITPROXYCONNECT;
LAB_003d9e3b:
        iVar32 = 0;
joined_r0x003d98eb:
        iVar25 = iVar32;
        if (!bVar33) {
LAB_003d9e42:
          iVar32 = iVar25;
          data->mstate = CVar31;
        }
        goto LAB_003da004;
      case CURLM_STATE_WAITPROXYCONNECT:
        CVar23 = Curl_http_connect(data->conn,&protocol_connect);
        pcVar28 = data->conn;
        if (((pcVar28->bits).field_0x6 & 0x80) == 0) {
          if (CVar23 == CURLE_OK) {
            if ((pcVar28->http_proxy).proxytype == CURLPROXY_HTTPS) {
              bVar33 = false;
              CVar23 = CURLE_OK;
              iVar32 = 0;
              if ((pcVar28->bits).proxy_ssl_connected[0] != true) break;
            }
            _Var21 = Curl_connect_complete(pcVar28);
            bVar33 = false;
            CVar23 = CURLE_OK;
            iVar32 = 0;
            if (!_Var21) break;
            bVar33 = data->mstate == CURLM_STATE_SENDPROTOCONNECT;
            CVar31 = CURLM_STATE_SENDPROTOCONNECT;
            goto LAB_003d98e6;
          }
LAB_003d982e:
          iVar32 = 0;
          bVar33 = true;
          break;
        }
        multi_done(data,CURLE_OK,false);
        iVar32 = -1;
        if (data->mstate != CURLM_STATE_CONNECT) {
          data->mstate = CURLM_STATE_CONNECT;
          Curl_init_CONNECT(data);
          goto LAB_003d9be5;
        }
        goto LAB_003da004;
      case CURLM_STATE_SENDPROTOCONNECT:
        CVar23 = Curl_protocol_connect(data->conn,&protocol_connect);
        if (CVar23 != CURLE_OK) {
LAB_003d97d4:
          Curl_posttransfer(data);
          _Var21 = true;
LAB_003d9829:
          multi_done(data,CVar23,_Var21);
          goto LAB_003d982e;
        }
        CVar1 = data->mstate;
        if (protocol_connect == false) {
          iVar32 = 0;
          CVar31 = CURLM_STATE_PROTOCONNECT;
          iVar25 = 0;
          if (CVar1 != CURLM_STATE_PROTOCONNECT) goto LAB_003d9e42;
        }
        else {
joined_r0x003d96a8:
          iVar32 = -1;
          if (CVar1 != CURLM_STATE_DO) {
            data->mstate = CURLM_STATE_DO;
            Curl_connect_free(data);
            goto LAB_003d9be5;
          }
        }
        goto LAB_003da004;
      case CURLM_STATE_PROTOCONNECT:
        CVar23 = Curl_protocol_connecting(data->conn,&protocol_connect);
        if (CVar23 != CURLE_OK) goto LAB_003d97d4;
        bVar33 = false;
        CVar23 = CURLE_OK;
        iVar32 = 0;
        if (protocol_connect == true) {
LAB_003d9b00:
          CVar1 = data->mstate;
          goto joined_r0x003d96a8;
        }
        break;
      case CURLM_STATE_DO:
        pcVar28 = data->conn;
        if (((data->set).field_0x87c & 0x20) != 0) {
          Curl_conncontrol(pcVar28,0);
LAB_003d98e0:
          bVar33 = data->mstate == CURLM_STATE_DONE;
          CVar31 = CURLM_STATE_DONE;
LAB_003d98e6:
          iVar32 = -1;
          goto joined_r0x003d98eb;
        }
        p_Var3 = pcVar28->handler->do_it;
        if (p_Var3 != (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0) {
          CVar23 = (*p_Var3)(pcVar28,&dophase_done);
          if (CVar23 == CURLE_SEND_ERROR) {
            if (((data->conn->bits).field_0x4 & 2) != 0) {
              newurl = (char *)0x0;
              CVar22 = Curl_retry_request(data->conn,&newurl);
              bVar33 = CVar22 != CURLE_OK;
              if (!bVar33) {
                CVar22 = CURLE_SEND_ERROR;
              }
              Curl_posttransfer(data);
              iVar32 = 0;
              CVar23 = multi_done(data,CVar22,false);
              if (newurl == (char *)0x0) {
                bVar33 = true;
                CVar23 = CVar22;
              }
              else if (((CVar23 == CURLE_SEND_ERROR) || (CVar23 == CURLE_OK)) &&
                      (CVar23 = Curl_follow(data,newurl,FOLLOW_RETRY), CVar23 == CURLE_OK)) {
                if (data->mstate != CURLM_STATE_CONNECT) {
                  data->mstate = CURLM_STATE_CONNECT;
                  Curl_init_CONNECT(data);
                }
                iVar32 = -1;
                CVar23 = CURLE_OK;
              }
              (*Curl_cfree)(newurl);
              break;
            }
          }
          else if (CVar23 == CURLE_OK) {
            if (dophase_done == true) {
              do_complete(pcVar28);
            }
            goto LAB_003d94e7;
          }
          Curl_posttransfer(data);
          bVar33 = true;
          if (data->conn != (connectdata *)0x0) {
            iVar32 = 0;
            multi_done(data,CVar23,false);
          }
          break;
        }
LAB_003d94e7:
        if (dophase_done == false) {
          if ((((data->state).field_0x4e4 & 0x80) == 0) ||
             (((data->wildcard).state | CURLWC_MATCHING) != CURLWC_DONE)) {
            bVar33 = data->mstate == CURLM_STATE_DOING;
            CVar31 = CURLM_STATE_DOING;
            goto LAB_003d9e3b;
          }
          multi_done(data,CURLE_OK,false);
          goto LAB_003d98e0;
        }
        if (((data->conn->bits).field_0x5 & 8) == 0) {
          CVar31 = CURLM_STATE_DO_DONE;
          iVar32 = -1;
          iVar25 = iVar32;
          if (data->mstate != CURLM_STATE_DO_DONE) goto LAB_003d9e42;
        }
        else {
          iVar32 = 0;
          CVar31 = CURLM_STATE_DO_MORE;
          iVar25 = 0;
          if (data->mstate != CURLM_STATE_DO_MORE) goto LAB_003d9e42;
        }
        goto LAB_003da004;
      case CURLM_STATE_DOING:
        CVar23 = Curl_protocol_doing(data->conn,&dophase_done);
        if (CVar23 != CURLE_OK) {
LAB_003d9815:
          Curl_posttransfer(data);
          _Var21 = false;
          goto LAB_003d9829;
        }
        bVar33 = false;
        CVar23 = CURLE_OK;
        iVar32 = 0;
        if (dophase_done == true) {
          uVar6 = *(uint *)&(data->conn->bits).field_0x4 >> 0xb;
          iVar25 = 10;
          goto LAB_003d9bd9;
        }
        break;
      case CURLM_STATE_DO_MORE:
        pcVar28 = data->conn;
        control = 0;
        p_Var4 = pcVar28->handler->do_more;
        if (p_Var4 != (Curl_do_more_func)0x0) {
          CVar23 = (*p_Var4)(pcVar28,&control);
          if (CVar23 != CURLE_OK) goto LAB_003d9815;
          if (control == 1) {
            do_complete(pcVar28);
          }
          if (control != 0) {
            CVar31 = (uint)(control == 1) * 2 + CURLM_STATE_DOING;
            goto LAB_003d9bdd;
          }
        }
LAB_003d9f99:
        bVar33 = false;
        CVar23 = CURLE_OK;
LAB_003d9f9e:
        iVar32 = 0;
        break;
      case CURLM_STATE_DO_DONE:
        pcVar28 = data->conn;
        if (((pcVar28->bits).field_0x7 & 4) != 0) {
          process_pending_handles(multi);
          pcVar28 = data->conn;
        }
        if ((pcVar28->sockfd == -1) && (pcVar28->writesockfd == -1)) {
          if ((((data->state).field_0x4e4 & 0x80) != 0) && ((pcVar28->handler->flags & 0x1000) == 0)
             ) {
            (data->wildcard).state = CURLWC_DONE;
          }
          if (data->mstate != CURLM_STATE_DONE) {
            CVar31 = CURLM_STATE_DONE;
LAB_003d9b3e:
            data->mstate = CVar31;
          }
        }
        else if (data->mstate != CURLM_STATE_PERFORM) {
          CVar31 = CURLM_STATE_PERFORM;
          goto LAB_003d9b3e;
        }
LAB_003d9b45:
        bVar33 = false;
        iVar32 = -1;
        goto LAB_003d9fad;
      case CURLM_STATE_PERFORM:
        newurl = (char *)0x0;
        comeback = false;
        lVar29 = (data->set).max_send_speed;
        if (lVar29 < 1) {
          lVar29 = 0;
        }
        else {
          uVar13 = (data->progress).ul_limit_start.tv_sec;
          uVar14 = (data->progress).ul_limit_start.tv_usec;
          start.tv_usec = uVar14;
          start.tv_sec = uVar13;
          now_00._12_4_ = now_local._12_4_;
          now_00.tv_usec = now_local.tv_usec;
          now_00.tv_sec = now_local.tv_sec;
          start._12_4_ = 0;
          lVar29 = Curl_pgrsLimitWaitTime
                             ((data->progress).uploaded,(data->progress).ul_limit_size,lVar29,start,
                              now_00);
        }
        lVar30 = (data->set).max_recv_speed;
        if (lVar30 < 1) {
          tVar27 = 0;
        }
        else {
          uVar15 = (data->progress).dl_limit_start.tv_sec;
          uVar16 = (data->progress).dl_limit_start.tv_usec;
          start_00.tv_usec = uVar16;
          start_00.tv_sec = uVar15;
          now_01._12_4_ = now_local._12_4_;
          now_01.tv_usec = now_local.tv_usec;
          now_01.tv_sec = now_local.tv_sec;
          start_00._12_4_ = 0;
          tVar27 = Curl_pgrsLimitWaitTime
                             ((data->progress).downloaded,(data->progress).dl_limit_size,lVar30,
                              start_00,now_01);
        }
        if (lVar29 != 0 || tVar27 != 0) {
          now_05.tv_usec = now_local.tv_usec;
          now_05.tv_sec = now_local.tv_sec;
          now_05._12_4_ = 0;
          Curl_ratelimit(data,now_05);
          if (data->mstate != CURLM_STATE_TOOFAST) {
            data->mstate = CURLM_STATE_TOOFAST;
          }
          if (lVar29 < tVar27) {
            lVar29 = tVar27;
          }
          Curl_expire(data,lVar29,EXPIRE_TOOFAST);
          goto LAB_003d9b2d;
        }
        CVar22 = Curl_readwrite(data->conn,data,&done,&comeback);
        CVar23 = CVar22;
        if ((CVar22 == CURLE_RECV_ERROR | done) == 1) {
          CVar24 = Curl_retry_request(data->conn,&newurl);
          if (CVar22 == CURLE_OK) {
            CVar23 = CVar24;
          }
          if ((CVar24 != CURLE_OK) || (CVar23 = CVar22, newurl == (char *)0x0)) goto LAB_003d9a9a;
          done = true;
          CVar23 = CURLE_UNSUPPORTED_PROTOCOL;
        }
        else {
LAB_003d9a9a:
          if (CVar23 != CURLE_OK) {
            if ((CVar23 != CURLE_HTTP2_STREAM) && ((data->conn->handler->flags & 2) == 0)) {
              Curl_conncontrol(data->conn,2);
            }
            Curl_posttransfer(data);
            multi_done(data,CVar23,true);
            goto LAB_003d9b2d;
          }
          CVar23 = CURLE_OK;
          if ((done & 1U) == 0) {
            iVar25 = -(uint)comeback;
            goto switchD_003d9334_caseD_1;
          }
        }
        Curl_posttransfer(data);
        if (((char)CVar23 != '\0') || ((data->req).newurl != (char *)0x0)) {
          type = FOLLOW_RETRY;
          if ((char)CVar23 == '\0') {
            (*Curl_cfree)(newurl);
            newurl = (data->req).newurl;
            (data->req).newurl = (char *)0x0;
            type = FOLLOW_REDIR;
          }
          iVar25 = 0;
          multi_done(data,CURLE_OK,false);
          CVar23 = Curl_follow(data,newurl,type);
          if ((CVar23 == CURLE_OK) && (iVar25 = -1, data->mstate != CURLM_STATE_CONNECT)) {
            data->mstate = CURLM_STATE_CONNECT;
            Curl_init_CONNECT(data);
            iVar25 = -1;
          }
          (*Curl_cfree)(newurl);
          goto switchD_003d9334_caseD_1;
        }
        bVar33 = false;
        if ((data->req).location != (char *)0x0) {
          (*Curl_cfree)(newurl);
          newurl = (data->req).location;
          (data->req).location = (char *)0x0;
          CVar23 = Curl_follow(data,newurl,FOLLOW_FAKE);
          (*Curl_cfree)(newurl);
          iVar32 = 0;
          if (CVar23 == CURLE_OK) {
            bVar33 = false;
          }
          else {
            CVar23 = multi_done(data,CVar23,true);
            bVar33 = true;
            if (CVar23 != CURLE_OK) break;
          }
        }
        if (data->mstate != CURLM_STATE_DONE) {
          data->mstate = CURLM_STATE_DONE;
        }
LAB_003d9be8:
        CVar23 = CURLE_OK;
LAB_003d9bea:
        iVar32 = -1;
        break;
      case CURLM_STATE_TOOFAST:
        iVar25 = Curl_pgrsUpdate(data->conn);
        bVar33 = false;
        CVar23 = CURLE_ABORTED_BY_CALLBACK;
        iVar32 = 0;
        if (iVar25 == 0) {
          now_04.tv_usec = now_local.tv_usec;
          now_04.tv_sec = now_local.tv_sec;
          now_04._12_4_ = 0;
          CVar23 = Curl_speedcheck(data,now_04);
          if (CVar23 != CURLE_OK) goto LAB_003d9b2d;
          lVar29 = (data->set).max_send_speed;
          if (lVar29 < 1) {
            lVar29 = 0;
          }
          else {
            uVar17 = (data->progress).ul_limit_start.tv_sec;
            uVar18 = (data->progress).ul_limit_start.tv_usec;
            start_01.tv_usec = uVar18;
            start_01.tv_sec = uVar17;
            now_02._12_4_ = now_local._12_4_;
            now_02.tv_usec = now_local.tv_usec;
            now_02.tv_sec = now_local.tv_sec;
            start_01._12_4_ = 0;
            lVar29 = Curl_pgrsLimitWaitTime
                               ((data->progress).uploaded,(data->progress).ul_limit_size,lVar29,
                                start_01,now_02);
          }
          lVar30 = (data->set).max_recv_speed;
          if (lVar30 < 1) {
            lVar30 = 0;
          }
          else {
            uVar19 = (data->progress).dl_limit_start.tv_sec;
            uVar20 = (data->progress).dl_limit_start.tv_usec;
            start_02.tv_usec = uVar20;
            start_02.tv_sec = uVar19;
            now_03._12_4_ = now_local._12_4_;
            now_03.tv_usec = now_local.tv_usec;
            now_03.tv_sec = now_local.tv_sec;
            start_02._12_4_ = 0;
            lVar30 = Curl_pgrsLimitWaitTime
                               ((data->progress).downloaded,(data->progress).dl_limit_size,lVar30,
                                start_02,now_03);
          }
          if (lVar29 == 0 && lVar30 == 0) {
            if (data->mstate != CURLM_STATE_PERFORM) {
              data->mstate = CURLM_STATE_PERFORM;
            }
            now_06.tv_usec = now_local.tv_usec;
            now_06.tv_sec = now_local.tv_sec;
            now_06._12_4_ = 0;
            Curl_ratelimit(data,now_06);
          }
          else {
            if (lVar29 < lVar30) {
              lVar29 = lVar30;
            }
            Curl_expire(data,lVar29,EXPIRE_TOOFAST);
          }
          goto LAB_003d9f99;
        }
        break;
      case CURLM_STATE_DONE:
        if (data->conn != (connectdata *)0x0) {
          if (((data->conn->bits).field_0x7 & 4) != 0) {
            process_pending_handles(multi);
          }
          CVar22 = multi_done(data,CVar23,false);
          if (CVar23 == CURLE_OK) {
            CVar23 = CVar22;
          }
          if (data->conn != (connectdata *)0x0) {
            detach_connnection(data);
          }
        }
        if ((((data->state).field_0x4e4 & 0x80) != 0) && ((data->wildcard).state != CURLWC_DONE)) {
          CVar31 = CURLM_STATE_INIT;
          if (data->mstate != CURLM_STATE_INIT) goto LAB_003d9b3e;
          goto LAB_003d9b45;
        }
        mstate(data,CURLM_STATE_COMPLETED);
        bVar33 = false;
        goto LAB_003d9bea;
      case CURLM_STATE_MSGSENT:
        goto switchD_003d9334_caseD_10;
      default:
        return CURLM_INTERNAL_ERROR;
      }
      CVar31 = data->mstate;
      if (CVar31 < CURLM_STATE_COMPLETED) {
LAB_003d9fad:
        if (CVar23 == CURLE_OK) {
LAB_003da004:
          CVar23 = CURLE_OK;
          if ((data->conn != (connectdata *)0x0) &&
             (iVar25 = Curl_pgrsUpdate(data->conn), iVar25 != 0)) {
            Curl_conncontrol(data->conn,2);
            CVar31 = CURLM_STATE_COMPLETED - (data->mstate < CURLM_STATE_DONE);
            CVar23 = CURLE_ABORTED_BY_CALLBACK;
            goto LAB_003da031;
          }
        }
        else {
          process_pending_handles(multi);
          if (data->conn == (connectdata *)0x0) {
            if (data->mstate == CURLM_STATE_CONNECT) {
              Curl_posttransfer(data);
            }
          }
          else if (bVar33) {
            Curl_disconnect(data,data->conn,CVar23 == CURLE_OPERATION_TIMEDOUT);
            detach_connnection(data);
          }
          CVar31 = CURLM_STATE_COMPLETED;
LAB_003da031:
          mstate(data,CVar31);
          iVar32 = -1;
        }
        CVar31 = data->mstate;
      }
      if (CVar31 == CURLM_STATE_COMPLETED) {
        p_Var5 = (data->set).fmultidone;
        if (p_Var5 == (multidone_func)0x0) {
          (data->msg).extmsg.msg = CURLMSG_DONE;
          (data->msg).extmsg.easy_handle = data;
          (data->msg).extmsg.data.result = CVar23;
          Curl_llist_insert_next(local_40,(multi->msglist).tail,local_38,&local_38->list);
          iVar32 = 0;
        }
        else {
          (*p_Var5)(data,CVar23);
        }
        if (data->mstate != CURLM_STATE_MSGSENT) {
          data->mstate = CURLM_STATE_MSGSENT;
        }
      }
    } while ((iVar32 == -1) || (multi->recheckstate != false));
switchD_003d9334_caseD_10:
    data->result = CVar23;
    CVar26 = CURLM_OK;
  }
  return CVar26;
}

Assistant:

static CURLMcode multi_runsingle(struct Curl_multi *multi,
                                 struct curltime now,
                                 struct Curl_easy *data)
{
  struct Curl_message *msg = NULL;
  bool connected;
  bool async;
  bool protocol_connect = FALSE;
  bool dophase_done = FALSE;
  bool done = FALSE;
  CURLMcode rc;
  CURLcode result = CURLE_OK;
  timediff_t timeout_ms;
  timediff_t recv_timeout_ms;
  timediff_t send_timeout_ms;
  int control;

  if(!GOOD_EASY_HANDLE(data))
    return CURLM_BAD_EASY_HANDLE;

  do {
    /* A "stream" here is a logical stream if the protocol can handle that
       (HTTP/2), or the full connection for older protocols */
    bool stream_error = FALSE;
    rc = CURLM_OK;

    if(!data->conn &&
       data->mstate > CURLM_STATE_CONNECT &&
       data->mstate < CURLM_STATE_DONE) {
      /* In all these states, the code will blindly access 'data->conn'
         so this is precaution that it isn't NULL. And it silences static
         analyzers. */
      failf(data, "In state %d with no conn, bail out!\n", data->mstate);
      return CURLM_INTERNAL_ERROR;
    }

    if(multi_ischanged(multi, TRUE)) {
      DEBUGF(infof(data, "multi changed, check CONNECT_PEND queue!\n"));
      process_pending_handles(multi); /* multiplexed */
    }

    if(data->conn && data->mstate > CURLM_STATE_CONNECT &&
       data->mstate < CURLM_STATE_COMPLETED) {
      /* Make sure we set the connection's current owner */
      data->conn->data = data;
    }

    if(data->conn &&
       (data->mstate >= CURLM_STATE_CONNECT) &&
       (data->mstate < CURLM_STATE_COMPLETED)) {
      /* we need to wait for the connect state as only then is the start time
         stored, but we must not check already completed handles */
      timeout_ms = Curl_timeleft(data, &now,
                                 (data->mstate <= CURLM_STATE_DO)?
                                 TRUE:FALSE);

      if(timeout_ms < 0) {
        /* Handle timed out */
        if(data->mstate == CURLM_STATE_WAITRESOLVE)
          failf(data, "Resolving timed out after %" CURL_FORMAT_TIMEDIFF_T
                " milliseconds",
                Curl_timediff(now, data->progress.t_startsingle));
        else if(data->mstate == CURLM_STATE_WAITCONNECT)
          failf(data, "Connection timed out after %" CURL_FORMAT_TIMEDIFF_T
                " milliseconds",
                Curl_timediff(now, data->progress.t_startsingle));
        else {
          struct SingleRequest *k = &data->req;
          if(k->size != -1) {
            failf(data, "Operation timed out after %" CURL_FORMAT_TIMEDIFF_T
                  " milliseconds with %" CURL_FORMAT_CURL_OFF_T " out of %"
                  CURL_FORMAT_CURL_OFF_T " bytes received",
                  Curl_timediff(now, data->progress.t_startsingle),
                  k->bytecount, k->size);
          }
          else {
            failf(data, "Operation timed out after %" CURL_FORMAT_TIMEDIFF_T
                  " milliseconds with %" CURL_FORMAT_CURL_OFF_T
                  " bytes received",
                  Curl_timediff(now, data->progress.t_startsingle),
                  k->bytecount);
          }
        }

        /* Force connection closed if the connection has indeed been used */
        if(data->mstate > CURLM_STATE_DO) {
          streamclose(data->conn, "Disconnected with pending data");
          stream_error = TRUE;
        }
        result = CURLE_OPERATION_TIMEDOUT;
        (void)multi_done(data, result, TRUE);
        /* Skip the statemachine and go directly to error handling section. */
        goto statemachine_end;
      }
    }

    switch(data->mstate) {
    case CURLM_STATE_INIT:
      /* init this transfer. */
      result = Curl_pretransfer(data);

      if(!result) {
        /* after init, go CONNECT */
        multistate(data, CURLM_STATE_CONNECT);
        Curl_pgrsTime(data, TIMER_STARTOP);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      break;

    case CURLM_STATE_CONNECT_PEND:
      /* We will stay here until there is a connection available. Then
         we try again in the CURLM_STATE_CONNECT state. */
      break;

    case CURLM_STATE_CONNECT:
      /* Connect. We want to get a connection identifier filled in. */
      Curl_pgrsTime(data, TIMER_STARTSINGLE);
      if(data->set.timeout)
        Curl_expire(data, data->set.timeout, EXPIRE_TIMEOUT);

      if(data->set.connecttimeout)
        Curl_expire(data, data->set.connecttimeout, EXPIRE_CONNECTTIMEOUT);

      result = Curl_connect(data, &async, &protocol_connect);
      if(CURLE_NO_CONNECTION_AVAILABLE == result) {
        /* There was no connection available. We will go to the pending
           state and wait for an available connection. */
        multistate(data, CURLM_STATE_CONNECT_PEND);

        /* add this handle to the list of connect-pending handles */
        Curl_llist_insert_next(&multi->pending, multi->pending.tail, data,
                               &data->connect_queue);
        result = CURLE_OK;
        break;
      }
      else if(data->state.previouslypending) {
        /* this transfer comes from the pending queue so try move another */
        infof(data, "Transfer was pending, now try another\n");
        process_pending_handles(data->multi);
      }

      if(!result) {
        if(async)
          /* We're now waiting for an asynchronous name lookup */
          multistate(data, CURLM_STATE_WAITRESOLVE);
        else {
          /* after the connect has been sent off, go WAITCONNECT unless the
             protocol connect is already done and we can go directly to
             WAITDO or DO! */
          rc = CURLM_CALL_MULTI_PERFORM;

          if(protocol_connect)
            multistate(data, CURLM_STATE_DO);
          else {
#ifndef CURL_DISABLE_HTTP
            if(Curl_connect_ongoing(data->conn))
              multistate(data, CURLM_STATE_WAITPROXYCONNECT);
            else
#endif
              multistate(data, CURLM_STATE_WAITCONNECT);
          }
        }
      }
      break;

    case CURLM_STATE_WAITRESOLVE:
      /* awaiting an asynch name resolve to complete */
    {
      struct Curl_dns_entry *dns = NULL;
      struct connectdata *conn = data->conn;
      const char *hostname;

      DEBUGASSERT(conn);
      if(conn->bits.httpproxy)
        hostname = conn->http_proxy.host.name;
      else if(conn->bits.conn_to_host)
        hostname = conn->conn_to_host.name;
      else
        hostname = conn->host.name;

      /* check if we have the name resolved by now */
      dns = Curl_fetch_addr(conn, hostname, (int)conn->port);

      if(dns) {
#ifdef CURLRES_ASYNCH
        conn->async.dns = dns;
        conn->async.done = TRUE;
#endif
        result = CURLE_OK;
        infof(data, "Hostname '%s' was found in DNS cache\n", hostname);
      }

      if(!dns)
        result = Curl_resolv_check(data->conn, &dns);

      /* Update sockets here, because the socket(s) may have been
         closed and the application thus needs to be told, even if it
         is likely that the same socket(s) will again be used further
         down.  If the name has not yet been resolved, it is likely
         that new sockets have been opened in an attempt to contact
         another resolver. */
      singlesocket(multi, data);

      if(dns) {
        /* Perform the next step in the connection phase, and then move on
           to the WAITCONNECT state */
        result = Curl_once_resolved(data->conn, &protocol_connect);

        if(result)
          /* if Curl_once_resolved() returns failure, the connection struct
             is already freed and gone */
          data->conn = NULL; /* no more connection */
        else {
          /* call again please so that we get the next socket setup */
          rc = CURLM_CALL_MULTI_PERFORM;
          if(protocol_connect)
            multistate(data, CURLM_STATE_DO);
          else {
#ifndef CURL_DISABLE_HTTP
            if(Curl_connect_ongoing(data->conn))
              multistate(data, CURLM_STATE_WAITPROXYCONNECT);
            else
#endif
              multistate(data, CURLM_STATE_WAITCONNECT);
          }
        }
      }

      if(result) {
        /* failure detected */
        stream_error = TRUE;
        break;
      }
    }
    break;

#ifndef CURL_DISABLE_HTTP
    case CURLM_STATE_WAITPROXYCONNECT:
      /* this is HTTP-specific, but sending CONNECT to a proxy is HTTP... */
      DEBUGASSERT(data->conn);
      result = Curl_http_connect(data->conn, &protocol_connect);

      if(data->conn->bits.proxy_connect_closed) {
        rc = CURLM_CALL_MULTI_PERFORM;
        /* connect back to proxy again */
        result = CURLE_OK;
        multi_done(data, CURLE_OK, FALSE);
        multistate(data, CURLM_STATE_CONNECT);
      }
      else if(!result) {
        if((data->conn->http_proxy.proxytype != CURLPROXY_HTTPS ||
           data->conn->bits.proxy_ssl_connected[FIRSTSOCKET]) &&
           Curl_connect_complete(data->conn)) {
          rc = CURLM_CALL_MULTI_PERFORM;
          /* initiate protocol connect phase */
          multistate(data, CURLM_STATE_SENDPROTOCONNECT);
        }
      }
      else if(result)
        stream_error = TRUE;
      break;
#endif

    case CURLM_STATE_WAITCONNECT:
      /* awaiting a completion of an asynch TCP connect */
      DEBUGASSERT(data->conn);
      result = Curl_is_connected(data->conn, FIRSTSOCKET, &connected);
      if(connected && !result) {
#ifndef CURL_DISABLE_HTTP
        if((data->conn->http_proxy.proxytype == CURLPROXY_HTTPS &&
            !data->conn->bits.proxy_ssl_connected[FIRSTSOCKET]) ||
           Curl_connect_ongoing(data->conn)) {
          multistate(data, CURLM_STATE_WAITPROXYCONNECT);
          break;
        }
#endif
        rc = CURLM_CALL_MULTI_PERFORM;
        multistate(data, data->conn->bits.tunnel_proxy?
                   CURLM_STATE_WAITPROXYCONNECT:
                   CURLM_STATE_SENDPROTOCONNECT);
      }
      else if(result) {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(data, result, TRUE);
        stream_error = TRUE;
        break;
      }
      break;

    case CURLM_STATE_SENDPROTOCONNECT:
      result = Curl_protocol_connect(data->conn, &protocol_connect);
      if(!result && !protocol_connect)
        /* switch to waiting state */
        multistate(data, CURLM_STATE_PROTOCONNECT);
      else if(!result) {
        /* protocol connect has completed, go WAITDO or DO */
        multistate(data, CURLM_STATE_DO);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      else if(result) {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(data, result, TRUE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_PROTOCONNECT:
      /* protocol-specific connect phase */
      result = Curl_protocol_connecting(data->conn, &protocol_connect);
      if(!result && protocol_connect) {
        /* after the connect has completed, go WAITDO or DO */
        multistate(data, CURLM_STATE_DO);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      else if(result) {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(data, result, TRUE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_DO:
      if(data->set.connect_only) {
        /* keep connection open for application to use the socket */
        connkeep(data->conn, "CONNECT_ONLY");
        multistate(data, CURLM_STATE_DONE);
        result = CURLE_OK;
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      else {
        /* Perform the protocol's DO action */
        result = multi_do(data, &dophase_done);

        /* When multi_do() returns failure, data->conn might be NULL! */

        if(!result) {
          if(!dophase_done) {
#ifndef CURL_DISABLE_FTP
            /* some steps needed for wildcard matching */
            if(data->state.wildcardmatch) {
              struct WildcardData *wc = &data->wildcard;
              if(wc->state == CURLWC_DONE || wc->state == CURLWC_SKIP) {
                /* skip some states if it is important */
                multi_done(data, CURLE_OK, FALSE);
                multistate(data, CURLM_STATE_DONE);
                rc = CURLM_CALL_MULTI_PERFORM;
                break;
              }
            }
#endif
            /* DO was not completed in one function call, we must continue
               DOING... */
            multistate(data, CURLM_STATE_DOING);
            rc = CURLM_OK;
          }

          /* after DO, go DO_DONE... or DO_MORE */
          else if(data->conn->bits.do_more) {
            /* we're supposed to do more, but we need to sit down, relax
               and wait a little while first */
            multistate(data, CURLM_STATE_DO_MORE);
            rc = CURLM_OK;
          }
          else {
            /* we're done with the DO, now DO_DONE */
            multistate(data, CURLM_STATE_DO_DONE);
            rc = CURLM_CALL_MULTI_PERFORM;
          }
        }
        else if((CURLE_SEND_ERROR == result) &&
                data->conn->bits.reuse) {
          /*
           * In this situation, a connection that we were trying to use
           * may have unexpectedly died.  If possible, send the connection
           * back to the CONNECT phase so we can try again.
           */
          char *newurl = NULL;
          followtype follow = FOLLOW_NONE;
          CURLcode drc;

          drc = Curl_retry_request(data->conn, &newurl);
          if(drc) {
            /* a failure here pretty much implies an out of memory */
            result = drc;
            stream_error = TRUE;
          }

          Curl_posttransfer(data);
          drc = multi_done(data, result, FALSE);

          /* When set to retry the connection, we must to go back to
           * the CONNECT state */
          if(newurl) {
            if(!drc || (drc == CURLE_SEND_ERROR)) {
              follow = FOLLOW_RETRY;
              drc = Curl_follow(data, newurl, follow);
              if(!drc) {
                multistate(data, CURLM_STATE_CONNECT);
                rc = CURLM_CALL_MULTI_PERFORM;
                result = CURLE_OK;
              }
              else {
                /* Follow failed */
                result = drc;
              }
            }
            else {
              /* done didn't return OK or SEND_ERROR */
              result = drc;
            }
          }
          else {
            /* Have error handler disconnect conn if we can't retry */
            stream_error = TRUE;
          }
          free(newurl);
        }
        else {
          /* failure detected */
          Curl_posttransfer(data);
          if(data->conn)
            multi_done(data, result, FALSE);
          stream_error = TRUE;
        }
      }
      break;

    case CURLM_STATE_DOING:
      /* we continue DOING until the DO phase is complete */
      DEBUGASSERT(data->conn);
      result = Curl_protocol_doing(data->conn,
                                   &dophase_done);
      if(!result) {
        if(dophase_done) {
          /* after DO, go DO_DONE or DO_MORE */
          multistate(data, data->conn->bits.do_more?
                     CURLM_STATE_DO_MORE:
                     CURLM_STATE_DO_DONE);
          rc = CURLM_CALL_MULTI_PERFORM;
        } /* dophase_done */
      }
      else {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(data, result, FALSE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_DO_MORE:
      /*
       * When we are connected, DO MORE and then go DO_DONE
       */
      DEBUGASSERT(data->conn);
      result = multi_do_more(data->conn, &control);

      if(!result) {
        if(control) {
          /* if positive, advance to DO_DONE
             if negative, go back to DOING */
          multistate(data, control == 1?
                     CURLM_STATE_DO_DONE:
                     CURLM_STATE_DOING);
          rc = CURLM_CALL_MULTI_PERFORM;
        }
        else
          /* stay in DO_MORE */
          rc = CURLM_OK;
      }
      else {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(data, result, FALSE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_DO_DONE:
      DEBUGASSERT(data->conn);
      if(data->conn->bits.multiplex)
        /* Check if we can move pending requests to send pipe */
        process_pending_handles(multi); /*  multiplexed */

      /* Only perform the transfer if there's a good socket to work with.
         Having both BAD is a signal to skip immediately to DONE */
      if((data->conn->sockfd != CURL_SOCKET_BAD) ||
         (data->conn->writesockfd != CURL_SOCKET_BAD))
        multistate(data, CURLM_STATE_PERFORM);
      else {
#ifndef CURL_DISABLE_FTP
        if(data->state.wildcardmatch &&
           ((data->conn->handler->flags & PROTOPT_WILDCARD) == 0)) {
          data->wildcard.state = CURLWC_DONE;
        }
#endif
        multistate(data, CURLM_STATE_DONE);
      }
      rc = CURLM_CALL_MULTI_PERFORM;
      break;

    case CURLM_STATE_TOOFAST: /* limit-rate exceeded in either direction */
      DEBUGASSERT(data->conn);
      /* if both rates are within spec, resume transfer */
      if(Curl_pgrsUpdate(data->conn))
        result = CURLE_ABORTED_BY_CALLBACK;
      else
        result = Curl_speedcheck(data, now);

      if(!result) {
        send_timeout_ms = 0;
        if(data->set.max_send_speed > 0)
          send_timeout_ms =
            Curl_pgrsLimitWaitTime(data->progress.uploaded,
                                   data->progress.ul_limit_size,
                                   data->set.max_send_speed,
                                   data->progress.ul_limit_start,
                                   now);

        recv_timeout_ms = 0;
        if(data->set.max_recv_speed > 0)
          recv_timeout_ms =
            Curl_pgrsLimitWaitTime(data->progress.downloaded,
                                   data->progress.dl_limit_size,
                                   data->set.max_recv_speed,
                                   data->progress.dl_limit_start,
                                   now);

        if(!send_timeout_ms && !recv_timeout_ms) {
          multistate(data, CURLM_STATE_PERFORM);
          Curl_ratelimit(data, now);
        }
        else if(send_timeout_ms >= recv_timeout_ms)
          Curl_expire(data, send_timeout_ms, EXPIRE_TOOFAST);
        else
          Curl_expire(data, recv_timeout_ms, EXPIRE_TOOFAST);
      }
      break;

    case CURLM_STATE_PERFORM:
    {
      char *newurl = NULL;
      bool retry = FALSE;
      bool comeback = FALSE;

      /* check if over send speed */
      send_timeout_ms = 0;
      if(data->set.max_send_speed > 0)
        send_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.uploaded,
                                                 data->progress.ul_limit_size,
                                                 data->set.max_send_speed,
                                                 data->progress.ul_limit_start,
                                                 now);

      /* check if over recv speed */
      recv_timeout_ms = 0;
      if(data->set.max_recv_speed > 0)
        recv_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.downloaded,
                                                 data->progress.dl_limit_size,
                                                 data->set.max_recv_speed,
                                                 data->progress.dl_limit_start,
                                                 now);

      if(send_timeout_ms || recv_timeout_ms) {
        Curl_ratelimit(data, now);
        multistate(data, CURLM_STATE_TOOFAST);
        if(send_timeout_ms >= recv_timeout_ms)
          Curl_expire(data, send_timeout_ms, EXPIRE_TOOFAST);
        else
          Curl_expire(data, recv_timeout_ms, EXPIRE_TOOFAST);
        break;
      }

      /* read/write data if it is ready to do so */
      result = Curl_readwrite(data->conn, data, &done, &comeback);

      if(done || (result == CURLE_RECV_ERROR)) {
        /* If CURLE_RECV_ERROR happens early enough, we assume it was a race
         * condition and the server closed the re-used connection exactly when
         * we wanted to use it, so figure out if that is indeed the case.
         */
        CURLcode ret = Curl_retry_request(data->conn, &newurl);
        if(!ret)
          retry = (newurl)?TRUE:FALSE;
        else if(!result)
          result = ret;

        if(retry) {
          /* if we are to retry, set the result to OK and consider the
             request as done */
          result = CURLE_OK;
          done = TRUE;
        }
      }
      else if((CURLE_HTTP2_STREAM == result) &&
              Curl_h2_http_1_1_error(data->conn)) {
        CURLcode ret = Curl_retry_request(data->conn, &newurl);

        if(!ret) {
          infof(data, "Downgrades to HTTP/1.1!\n");
          data->set.httpversion = CURL_HTTP_VERSION_1_1;
          /* clear the error message bit too as we ignore the one we got */
          data->state.errorbuf = FALSE;
          if(!newurl)
            /* typically for HTTP_1_1_REQUIRED error on first flight */
            newurl = strdup(data->change.url);
          /* if we are to retry, set the result to OK and consider the request
             as done */
          retry = TRUE;
          result = CURLE_OK;
          done = TRUE;
        }
        else
          result = ret;
      }

      if(result) {
        /*
         * The transfer phase returned error, we mark the connection to get
         * closed to prevent being re-used. This is because we can't possibly
         * know if the connection is in a good shape or not now.  Unless it is
         * a protocol which uses two "channels" like FTP, as then the error
         * happened in the data connection.
         */

        if(!(data->conn->handler->flags & PROTOPT_DUAL) &&
           result != CURLE_HTTP2_STREAM)
          streamclose(data->conn, "Transfer returned error");

        Curl_posttransfer(data);
        multi_done(data, result, TRUE);
      }
      else if(done) {
        followtype follow = FOLLOW_NONE;

        /* call this even if the readwrite function returned error */
        Curl_posttransfer(data);

        /* When we follow redirects or is set to retry the connection, we must
           to go back to the CONNECT state */
        if(data->req.newurl || retry) {
          if(!retry) {
            /* if the URL is a follow-location and not just a retried request
               then figure out the URL here */
            free(newurl);
            newurl = data->req.newurl;
            data->req.newurl = NULL;
            follow = FOLLOW_REDIR;
          }
          else
            follow = FOLLOW_RETRY;
          (void)multi_done(data, CURLE_OK, FALSE);
          /* multi_done() might return CURLE_GOT_NOTHING */
          result = Curl_follow(data, newurl, follow);
          if(!result) {
            multistate(data, CURLM_STATE_CONNECT);
            rc = CURLM_CALL_MULTI_PERFORM;
          }
          free(newurl);
        }
        else {
          /* after the transfer is done, go DONE */

          /* but first check to see if we got a location info even though we're
             not following redirects */
          if(data->req.location) {
            free(newurl);
            newurl = data->req.location;
            data->req.location = NULL;
            result = Curl_follow(data, newurl, FOLLOW_FAKE);
            free(newurl);
            if(result) {
              stream_error = TRUE;
              result = multi_done(data, result, TRUE);
            }
          }

          if(!result) {
            multistate(data, CURLM_STATE_DONE);
            rc = CURLM_CALL_MULTI_PERFORM;
          }
        }
      }
      else if(comeback)
        rc = CURLM_CALL_MULTI_PERFORM;
      break;
    }

    case CURLM_STATE_DONE:
      /* this state is highly transient, so run another loop after this */
      rc = CURLM_CALL_MULTI_PERFORM;

      if(data->conn) {
        CURLcode res;

        if(data->conn->bits.multiplex)
          /* Check if we can move pending requests to connection */
          process_pending_handles(multi); /* multiplexing */

        /* post-transfer command */
        res = multi_done(data, result, FALSE);

        /* allow a previously set error code take precedence */
        if(!result)
          result = res;

        /*
         * If there are other handles on the connection, multi_done won't set
         * conn to NULL.  In such a case, curl_multi_remove_handle() can
         * access free'd data, if the connection is free'd and the handle
         * removed before we perform the processing in CURLM_STATE_COMPLETED
         */
        if(data->conn)
          detach_connnection(data);
      }

#ifndef CURL_DISABLE_FTP
      if(data->state.wildcardmatch) {
        if(data->wildcard.state != CURLWC_DONE) {
          /* if a wildcard is set and we are not ending -> lets start again
             with CURLM_STATE_INIT */
          multistate(data, CURLM_STATE_INIT);
          break;
        }
      }
#endif
      /* after we have DONE what we're supposed to do, go COMPLETED, and
         it doesn't matter what the multi_done() returned! */
      multistate(data, CURLM_STATE_COMPLETED);
      break;

    case CURLM_STATE_COMPLETED:
      break;

    case CURLM_STATE_MSGSENT:
      data->result = result;
      return CURLM_OK; /* do nothing */

    default:
      return CURLM_INTERNAL_ERROR;
    }
    statemachine_end:

    if(data->mstate < CURLM_STATE_COMPLETED) {
      if(result) {
        /*
         * If an error was returned, and we aren't in completed state now,
         * then we go to completed and consider this transfer aborted.
         */

        /* NOTE: no attempt to disconnect connections must be made
           in the case blocks above - cleanup happens only here */

        /* Check if we can move pending requests to send pipe */
        process_pending_handles(multi); /* connection */

        if(data->conn) {
          if(stream_error) {
            /* Don't attempt to send data over a connection that timed out */
            bool dead_connection = result == CURLE_OPERATION_TIMEDOUT;
            /* disconnect properly */
            Curl_disconnect(data, data->conn, dead_connection);

            /* This is where we make sure that the conn pointer is reset.
               We don't have to do this in every case block above where a
               failure is detected */
            detach_connnection(data);
          }
        }
        else if(data->mstate == CURLM_STATE_CONNECT) {
          /* Curl_connect() failed */
          (void)Curl_posttransfer(data);
        }

        multistate(data, CURLM_STATE_COMPLETED);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      /* if there's still a connection to use, call the progress function */
      else if(data->conn && Curl_pgrsUpdate(data->conn)) {
        /* aborted due to progress callback return code must close the
           connection */
        result = CURLE_ABORTED_BY_CALLBACK;
        streamclose(data->conn, "Aborted by callback");

        /* if not yet in DONE state, go there, otherwise COMPLETED */
        multistate(data, (data->mstate < CURLM_STATE_DONE)?
                   CURLM_STATE_DONE: CURLM_STATE_COMPLETED);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
    }

    if(CURLM_STATE_COMPLETED == data->mstate) {
      if(data->set.fmultidone) {
        /* signal via callback instead */
        data->set.fmultidone(data, result);
      }
      else {
        /* now fill in the Curl_message with this info */
        msg = &data->msg;

        msg->extmsg.msg = CURLMSG_DONE;
        msg->extmsg.easy_handle = data;
        msg->extmsg.data.result = result;

        rc = multi_addmsg(multi, msg);
        DEBUGASSERT(!data->conn);
      }
      multistate(data, CURLM_STATE_MSGSENT);
    }
  } while((rc == CURLM_CALL_MULTI_PERFORM) || multi_ischanged(multi, FALSE));

  data->result = result;
  return rc;
}